

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Status XML_SetBase(XML_Parser parser,XML_Char *p)

{
  XML_Char *pXVar1;
  XML_Status XVar2;
  
  if (parser == (XML_Parser)0x0) {
    XVar2 = XML_STATUS_ERROR;
  }
  else {
    if (p == (XML_Char *)0x0) {
      pXVar1 = (XML_Char *)0x0;
    }
    else {
      pXVar1 = poolCopyString(&parser->m_dtd->pool,p);
      if (pXVar1 == (XML_Char *)0x0) {
        return XML_STATUS_ERROR;
      }
    }
    parser->m_curBase = pXVar1;
    XVar2 = XML_STATUS_OK;
  }
  return XVar2;
}

Assistant:

enum XML_Status XMLCALL
XML_SetBase(XML_Parser parser, const XML_Char *p) {
  if (parser == NULL)
    return XML_STATUS_ERROR;
  if (p) {
    p = poolCopyString(&parser->m_dtd->pool, p);
    if (! p)
      return XML_STATUS_ERROR;
    parser->m_curBase = p;
  } else
    parser->m_curBase = NULL;
  return XML_STATUS_OK;
}